

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

void google::protobuf::compiler::cpp::ListAllFields
               (Descriptor *d,
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *fields)

{
  int iVar1;
  Descriptor *in_RSI;
  Descriptor *in_RDI;
  int i_2;
  int i_1;
  int i;
  value_type *in_stack_ffffffffffffffa8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_stack_ffffffffffffffb0;
  undefined4 local_24;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  int iVar3;
  Descriptor *pDVar4;
  
  iVar3 = 0;
  while( true ) {
    iVar2 = iVar3;
    iVar1 = Descriptor::nested_type_count(in_RDI);
    if (iVar1 <= iVar3) break;
    Descriptor::nested_type(in_RDI,iVar2);
    ListAllFields(in_RSI,(vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    iVar3 = iVar2 + 1;
  }
  iVar3 = 0;
  while( true ) {
    iVar2 = iVar3;
    iVar1 = Descriptor::extension_count(in_RDI);
    if (iVar1 <= iVar3) break;
    Descriptor::extension(in_RDI,iVar2);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    iVar3 = iVar2 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar3 = Descriptor::field_count(in_RDI);
    if (iVar3 <= local_24) break;
    pDVar4 = in_RSI;
    Descriptor::field(in_RDI,local_24);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)in_RSI,in_stack_ffffffffffffffa8);
    local_24 = local_24 + 1;
    in_RSI = pDVar4;
  }
  return;
}

Assistant:

void ListAllFields(const Descriptor* d,
                   std::vector<const FieldDescriptor*>* fields) {
  // Collect sub messages
  for (int i = 0; i < d->nested_type_count(); i++) {
    ListAllFields(d->nested_type(i), fields);
  }
  // Collect message level extensions.
  for (int i = 0; i < d->extension_count(); i++) {
    fields->push_back(d->extension(i));
  }
  // Add types of fields necessary
  for (int i = 0; i < d->field_count(); i++) {
    fields->push_back(d->field(i));
  }
}